

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  float *pfVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  ulong uVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  float *slope;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [16];
  int iVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [28];
  float fVar29;
  undefined1 auVar26 [28];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined4 uVar34;
  uint uVar35;
  undefined1 in_ZMM7 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  
  auVar7 = _DAT_00318410;
  auVar4 = _DAT_003183f0;
  iVar12 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar12 == 3) {
      iVar12 = bottom_top_blob->c;
      if (0 < (long)iVar12) {
        iVar13 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var6 = this->_vptr_PReLU_x86_avx;
        lVar14 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]) < 2) {
            fVar23 = **(float **)(&this->field_0xd8 + (long)pp_Var6[-3]);
            fVar27 = fVar23;
            fVar28 = fVar23;
            fVar29 = fVar23;
          }
          else {
            pfVar5 = *(float **)(&this->field_0xd8 + (long)pp_Var6[-3]) + lVar14 * 4;
            fVar23 = *pfVar5;
            fVar27 = pfVar5[1];
            fVar28 = pfVar5[2];
            fVar29 = pfVar5[3];
          }
          if (0 < iVar13) {
            pauVar19 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar14 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar13;
            do {
              auVar4 = vmaxps_avx(*pauVar19,ZEXT816(0));
              auVar7 = vminps_avx(*pauVar19,ZEXT816(0));
              auVar31._0_4_ = auVar7._0_4_ * fVar23 + auVar4._0_4_;
              auVar31._4_4_ = auVar7._4_4_ * fVar27 + auVar4._4_4_;
              auVar31._8_4_ = auVar7._8_4_ * fVar28 + auVar4._8_4_;
              auVar31._12_4_ = auVar7._12_4_ * fVar29 + auVar4._12_4_;
              *pauVar19 = auVar31;
              pauVar19 = pauVar19 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != iVar12);
      }
    }
    else if (iVar12 == 2) {
      iVar12 = bottom_top_blob->h;
      if (0 < (long)iVar12) {
        iVar13 = bottom_top_blob->w;
        pp_Var6 = this->_vptr_PReLU_x86_avx;
        lVar14 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]) < 2) {
            fVar23 = **(float **)(&this->field_0xd8 + (long)pp_Var6[-3]);
            fVar27 = fVar23;
            fVar28 = fVar23;
            fVar29 = fVar23;
          }
          else {
            pfVar5 = *(float **)(&this->field_0xd8 + (long)pp_Var6[-3]) + lVar14 * 4;
            fVar23 = *pfVar5;
            fVar27 = pfVar5[1];
            fVar28 = pfVar5[2];
            fVar29 = pfVar5[3];
          }
          if (0 < iVar13) {
            pauVar19 = (undefined1 (*) [16])
                       (bottom_top_blob->w * lVar14 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar13;
            do {
              auVar4 = vmaxps_avx(*pauVar19,ZEXT816(0));
              auVar7 = vminps_avx(*pauVar19,ZEXT816(0));
              auVar30._0_4_ = auVar7._0_4_ * fVar23 + auVar4._0_4_;
              auVar30._4_4_ = auVar7._4_4_ * fVar27 + auVar4._4_4_;
              auVar30._8_4_ = auVar7._8_4_ * fVar28 + auVar4._8_4_;
              auVar30._12_4_ = auVar7._12_4_ * fVar29 + auVar4._12_4_;
              *pauVar19 = auVar30;
              pauVar19 = pauVar19 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != iVar12);
      }
    }
    else if (iVar12 == 1) {
      uVar17 = bottom_top_blob->w;
      pfVar5 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
        if (0 < (int)uVar17) {
          fVar23 = *pfVar5;
          lVar14 = 0;
          do {
            auVar4 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar14);
            auVar7 = vmaxps_avx(auVar4,ZEXT816(0));
            auVar4 = vminps_avx(auVar4,ZEXT816(0));
            pfVar5 = (float *)((long)bottom_top_blob->data + lVar14);
            *pfVar5 = auVar4._0_4_ * fVar23 + auVar7._0_4_;
            pfVar5[1] = auVar4._4_4_ * fVar23 + auVar7._4_4_;
            pfVar5[2] = auVar4._8_4_ * fVar23 + auVar7._8_4_;
            pfVar5[3] = auVar4._12_4_ * fVar23 + auVar7._12_4_;
            lVar14 = lVar14 + 0x10;
          } while ((ulong)uVar17 << 4 != lVar14);
        }
      }
      else if (0 < (int)uVar17) {
        lVar14 = 0;
        do {
          auVar4 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar14);
          auVar7 = vmaxps_avx(auVar4,ZEXT816(0));
          auVar4 = vminps_avx(auVar4,ZEXT816(0));
          pfVar1 = (float *)((long)pfVar5 + lVar14);
          fVar23 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar28 = pfVar1[3];
          pfVar2 = (float *)((long)bottom_top_blob->data + lVar14);
          *pfVar2 = auVar4._0_4_ * *pfVar1 + auVar7._0_4_;
          pfVar2[1] = auVar4._4_4_ * fVar23 + auVar7._4_4_;
          pfVar2[2] = auVar4._8_4_ * fVar27 + auVar7._8_4_;
          pfVar2[3] = auVar4._12_4_ * fVar28 + auVar7._12_4_;
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar17 << 4 != lVar14);
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar12 == 3) {
      iVar12 = bottom_top_blob->c;
      if (0 < (long)iVar12) {
        iVar13 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var6 = this->_vptr_PReLU_x86_avx;
        lVar14 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]) < 2) {
            uVar34 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var6[-3]);
            auVar26._4_4_ = uVar34;
            auVar26._0_4_ = uVar34;
            auVar26._8_4_ = uVar34;
            auVar26._12_4_ = uVar34;
            auVar26._16_4_ = uVar34;
            auVar26._20_4_ = uVar34;
            auVar26._24_4_ = uVar34;
          }
          else {
            auVar26 = SUB3228(*(undefined1 (*) [32])
                               (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var6[-3]) + lVar14 * 8
                               ),0);
          }
          if (0 < iVar13) {
            pauVar18 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar14 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar13;
            do {
              auVar36 = vmaxps_avx(*pauVar18,ZEXT832(0));
              auVar8 = vminps_avx(*pauVar18,ZEXT832(0));
              auVar33._0_4_ = auVar8._0_4_ * auVar26._0_4_ + auVar36._0_4_;
              auVar33._4_4_ = auVar8._4_4_ * auVar26._4_4_ + auVar36._4_4_;
              auVar33._8_4_ = auVar8._8_4_ * auVar26._8_4_ + auVar36._8_4_;
              auVar33._12_4_ = auVar8._12_4_ * auVar26._12_4_ + auVar36._12_4_;
              auVar33._16_4_ = auVar8._16_4_ * auVar26._16_4_ + auVar36._16_4_;
              auVar33._20_4_ = auVar8._20_4_ * auVar26._20_4_ + auVar36._20_4_;
              auVar33._24_4_ = auVar8._24_4_ * auVar26._24_4_ + auVar36._24_4_;
              auVar33._28_4_ = auVar8._28_4_ + auVar36._28_4_;
              *pauVar18 = auVar33;
              pauVar18 = pauVar18 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != iVar12);
      }
    }
    else if (iVar12 == 2) {
      iVar12 = bottom_top_blob->h;
      if (0 < (long)iVar12) {
        iVar13 = bottom_top_blob->w;
        pp_Var6 = this->_vptr_PReLU_x86_avx;
        lVar14 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]) < 2) {
            uVar34 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var6[-3]);
            auVar25._4_4_ = uVar34;
            auVar25._0_4_ = uVar34;
            auVar25._8_4_ = uVar34;
            auVar25._12_4_ = uVar34;
            auVar25._16_4_ = uVar34;
            auVar25._20_4_ = uVar34;
            auVar25._24_4_ = uVar34;
          }
          else {
            auVar25 = SUB3228(*(undefined1 (*) [32])
                               (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var6[-3]) + lVar14 * 8
                               ),0);
          }
          if (0 < iVar13) {
            pauVar18 = (undefined1 (*) [32])
                       (bottom_top_blob->w * lVar14 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar13;
            do {
              auVar36 = vmaxps_avx(*pauVar18,ZEXT832(0));
              auVar8 = vminps_avx(*pauVar18,ZEXT832(0));
              auVar32._0_4_ = auVar8._0_4_ * auVar25._0_4_ + auVar36._0_4_;
              auVar32._4_4_ = auVar8._4_4_ * auVar25._4_4_ + auVar36._4_4_;
              auVar32._8_4_ = auVar8._8_4_ * auVar25._8_4_ + auVar36._8_4_;
              auVar32._12_4_ = auVar8._12_4_ * auVar25._12_4_ + auVar36._12_4_;
              auVar32._16_4_ = auVar8._16_4_ * auVar25._16_4_ + auVar36._16_4_;
              auVar32._20_4_ = auVar8._20_4_ * auVar25._20_4_ + auVar36._20_4_;
              auVar32._24_4_ = auVar8._24_4_ * auVar25._24_4_ + auVar36._24_4_;
              auVar32._28_4_ = auVar8._28_4_ + auVar36._28_4_;
              *pauVar18 = auVar32;
              pauVar18 = pauVar18 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != iVar12);
      }
    }
    else if (iVar12 == 1) {
      uVar17 = bottom_top_blob->w;
      pfVar5 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
        if (0 < (int)uVar17) {
          fVar23 = *pfVar5;
          lVar14 = 0;
          do {
            auVar36 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar14);
            auVar8 = vmaxps_avx(auVar36,ZEXT832(0));
            auVar36 = vminps_avx(auVar36,ZEXT832(0));
            pfVar5 = (float *)((long)bottom_top_blob->data + lVar14);
            *pfVar5 = auVar36._0_4_ * fVar23 + auVar8._0_4_;
            pfVar5[1] = auVar36._4_4_ * fVar23 + auVar8._4_4_;
            pfVar5[2] = auVar36._8_4_ * fVar23 + auVar8._8_4_;
            pfVar5[3] = auVar36._12_4_ * fVar23 + auVar8._12_4_;
            pfVar5[4] = auVar36._16_4_ * fVar23 + auVar8._16_4_;
            pfVar5[5] = auVar36._20_4_ * fVar23 + auVar8._20_4_;
            pfVar5[6] = auVar36._24_4_ * fVar23 + auVar8._24_4_;
            pfVar5[7] = auVar36._28_4_ + auVar8._28_4_;
            lVar14 = lVar14 + 0x20;
          } while ((ulong)uVar17 << 5 != lVar14);
        }
      }
      else if (0 < (int)uVar17) {
        lVar14 = 0;
        do {
          auVar36 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar14);
          auVar8 = vmaxps_avx(auVar36,ZEXT832(0));
          auVar36 = vminps_avx(auVar36,ZEXT832(0));
          pfVar1 = (float *)((long)pfVar5 + lVar14);
          fVar23 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar28 = pfVar1[3];
          fVar29 = pfVar1[4];
          fVar10 = pfVar1[5];
          fVar11 = pfVar1[6];
          pfVar2 = (float *)((long)bottom_top_blob->data + lVar14);
          *pfVar2 = auVar36._0_4_ * *pfVar1 + auVar8._0_4_;
          pfVar2[1] = auVar36._4_4_ * fVar23 + auVar8._4_4_;
          pfVar2[2] = auVar36._8_4_ * fVar27 + auVar8._8_4_;
          pfVar2[3] = auVar36._12_4_ * fVar28 + auVar8._12_4_;
          pfVar2[4] = auVar36._16_4_ * fVar29 + auVar8._16_4_;
          pfVar2[5] = auVar36._20_4_ * fVar10 + auVar8._20_4_;
          pfVar2[6] = auVar36._24_4_ * fVar11 + auVar8._24_4_;
          pfVar2[7] = auVar36._28_4_ + auVar8._28_4_;
          lVar14 = lVar14 + 0x20;
        } while ((ulong)uVar17 << 5 != lVar14);
      }
    }
  }
  else {
    if (iVar12 != 3) {
      iVar12 = PReLU::forward_inplace
                         ((PReLU *)((long)&this->_vptr_PReLU_x86_avx +
                                   (long)this->_vptr_PReLU_x86_avx[-3]),bottom_top_blob,opt);
      return iVar12;
    }
    iVar12 = bottom_top_blob->c;
    if (0 < (long)iVar12) {
      pp_Var6 = this->_vptr_PReLU_x86_avx;
      lVar14 = *(long *)(&this->field_0xd8 + (long)pp_Var6[-3]);
      uVar17 = bottom_top_blob->h * bottom_top_blob->w;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (ulong)(uVar17 & 7) - 1;
      auVar31 = vpshufd_avx(auVar22,0x44);
      auVar24 = ZEXT816(0);
      uVar9 = auVar31._0_8_;
      auVar37._0_8_ = uVar9 ^ 0x8000000000000000;
      uVar34 = auVar31._8_4_;
      auVar37._8_4_ = uVar34;
      uVar35 = auVar31._12_4_;
      auVar37._12_4_ = uVar35 ^ 0x80000000;
      auVar30 = vpcmpgtq_avx(auVar37,_DAT_003183e0);
      auVar22 = vpcmpgtq_avx(_DAT_00318400,auVar37);
      auVar31 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
      auVar36._8_4_ = 0xffff;
      auVar36._0_8_ = 0xffff0000ffff;
      auVar36._12_4_ = 0xffff;
      auVar36._16_4_ = 0xffff;
      auVar36._20_4_ = 0xffff;
      auVar36._24_4_ = 0xffff;
      auVar36._28_4_ = 0xffff;
      uVar15 = 0;
      do {
        pauVar18 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar21 = uVar15 & 0xffffffff;
        if (*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]) < 2) {
          uVar21 = 0;
        }
        uVar3 = *(uint *)(lVar14 + uVar21 * 4);
        if (0 < (int)uVar17 >> 3) {
          auVar37 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          uVar16 = ((int)uVar17 >> 3) + 1;
          do {
            auVar8 = vmaxps_avx(*pauVar18,ZEXT1632(auVar24));
            auVar41 = vminps_avx(*pauVar18,ZEXT1632(auVar24));
            auVar40._0_4_ = auVar41._0_4_ * auVar37._0_4_ + auVar8._0_4_;
            auVar40._4_4_ = auVar41._4_4_ * auVar37._4_4_ + auVar8._4_4_;
            auVar40._8_4_ = auVar41._8_4_ * auVar37._8_4_ + auVar8._8_4_;
            auVar40._12_4_ = auVar41._12_4_ * auVar37._12_4_ + auVar8._12_4_;
            auVar40._16_4_ = auVar41._16_4_ * auVar37._0_4_ + auVar8._16_4_;
            auVar40._20_4_ = auVar41._20_4_ * auVar37._4_4_ + auVar8._20_4_;
            auVar40._24_4_ = auVar41._24_4_ * auVar37._8_4_ + auVar8._24_4_;
            auVar40._28_4_ = auVar41._28_4_ + auVar8._28_4_;
            *pauVar18 = auVar40;
            pauVar18 = pauVar18 + 1;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        if ((uVar17 & 7) != 0) {
          auVar42._0_8_ = uVar9 ^ 0x8000000000000000;
          auVar42._8_4_ = uVar34;
          auVar42._12_4_ = uVar35 ^ 0x80000000;
          auVar37 = vpcmpgtq_avx(auVar42,auVar4);
          auVar37 = vpackssdw_avx(auVar37,auVar30);
          auVar39._0_8_ = uVar9 ^ 0x8000000000000000;
          auVar39._8_4_ = uVar34;
          auVar39._12_4_ = uVar35 ^ 0x80000000;
          auVar42 = vpcmpgtq_avx(auVar7,auVar39);
          auVar42 = vpackssdw_avx(auVar42,auVar22);
          auVar37 = vpackssdw_avx(auVar42 ^ auVar31,auVar37);
          auVar42 = vpmovsxwd_avx(auVar37);
          auVar39 = vpunpckhwd_avx(auVar37,auVar37);
          auVar41._16_16_ = auVar39;
          auVar41._0_16_ = auVar42;
          auVar39 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          auVar41 = vmaskmovps_avx(auVar41,*pauVar18);
          auVar8 = vcmpps_avx(auVar41,ZEXT1632(auVar24),1);
          auVar8 = vandps_avx(auVar8,auVar36);
          auVar42 = vpackusdw_avx(auVar8._0_16_,auVar8._16_16_);
          auVar37 = vpand_avx(auVar37,auVar42);
          auVar42 = vpmovzxwd_avx(auVar37);
          auVar42 = vpslld_avx(auVar42,0x1f);
          auVar37 = vpunpckhwd_avx(auVar37,auVar37);
          auVar37 = vpslld_avx(auVar37,0x1f);
          auVar38._16_16_ = auVar37;
          auVar38._0_16_ = auVar42;
          auVar8._4_4_ = auVar41._4_4_ * auVar39._4_4_;
          auVar8._0_4_ = auVar41._0_4_ * auVar39._0_4_;
          auVar8._8_4_ = auVar41._8_4_ * auVar39._8_4_;
          auVar8._12_4_ = auVar41._12_4_ * auVar39._12_4_;
          auVar8._16_4_ = auVar41._16_4_ * auVar39._0_4_;
          auVar8._20_4_ = auVar41._20_4_ * auVar39._4_4_;
          auVar8._24_4_ = auVar41._24_4_ * auVar39._8_4_;
          auVar8._28_4_ = auVar39._12_4_;
          auVar8 = vmaskmovps_avx(auVar38,auVar8);
          *pauVar18 = auVar8;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (long)iVar12);
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}